

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O2

RDL_URFinfo * RDL_initUrfInfo(RDL_cfURF *RCFs,RDL_graph *graph)

{
  RDL_cfam **ppRVar1;
  uint uVar2;
  RDL_cfam **ppRVar3;
  RDL_URFinfo *pRVar4;
  ulong uVar5;
  uint *puVar6;
  char ***pppcVar7;
  char **ppcVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  
  pRVar4 = (RDL_URFinfo *)malloc(0x30);
  ppRVar3 = RCFs->fams;
  uVar12 = (*ppRVar3)->weight;
  uVar2 = RCFs->nofFams;
  uVar14 = 1;
  uVar10 = uVar12;
  for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    ppRVar1 = ppRVar3 + uVar5;
    uVar14 = uVar14 + ((*ppRVar1)->weight != uVar10);
    uVar10 = (*ppRVar1)->weight;
  }
  uVar15 = (ulong)uVar14;
  puVar6 = (uint *)malloc(uVar15 * 4);
  for (uVar5 = 0; uVar15 != uVar5; uVar5 = uVar5 + 1) {
    puVar6[uVar5] = 0;
  }
  uVar11 = 0;
  for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    uVar10 = ppRVar3[uVar5]->weight;
    uVar11 = (ulong)((int)uVar11 + (uint)(uVar10 != uVar12));
    puVar6[uVar11] = puVar6[uVar11] + 1;
    uVar12 = uVar10;
  }
  pppcVar7 = (char ***)malloc(uVar15 * 8);
  for (uVar5 = 0; uVar5 != uVar15; uVar5 = uVar5 + 1) {
    uVar12 = puVar6[uVar5];
    uVar13 = (ulong)uVar12;
    ppcVar8 = (char **)malloc(uVar13 * 8);
    pppcVar7[uVar5] = ppcVar8;
    pcVar9 = (char *)malloc((ulong)(uVar12 * uVar12));
    *ppcVar8 = pcVar9;
    for (uVar11 = 1; pcVar9 = pcVar9 + uVar13, uVar11 < uVar13; uVar11 = uVar11 + 1) {
      ppcVar8[uVar11] = pcVar9;
    }
  }
  for (uVar5 = 0; uVar5 != uVar15; uVar5 = uVar5 + 1) {
    uVar12 = puVar6[uVar5];
    for (uVar11 = 0; uVar11 < uVar12; uVar11 = uVar11 + 1) {
      for (uVar13 = 0; uVar13 < uVar12; uVar13 = uVar13 + 1) {
        pppcVar7[uVar5][uVar11][uVar13] = '\0';
      }
    }
  }
  pRVar4->nofWeights = uVar14;
  pRVar4->nofProtos = puVar6;
  pRVar4->URFrel = pppcVar7;
  return pRVar4;
}

Assistant:

RDL_URFinfo *RDL_initUrfInfo(RDL_cfURF *RCFs, RDL_graph *graph)
{
  RDL_URFinfo *urfInfo;
  char ***URFrel;
  unsigned numOfWeights = 1;
  unsigned *numOfProtos;
  unsigned i, j, k, currWeight, currIdx;
  urfInfo = malloc(sizeof(*urfInfo));

  /* count number of different weights occuring*/
  currWeight = RCFs->fams[0]->weight;
  for(i=0; i<RCFs->nofFams; ++i)
  {
    if(RCFs->fams[i]->weight != currWeight)
    {
      ++numOfWeights;
      currWeight = RCFs->fams[i]->weight;
    }
  }

  /* for each weight count number of different prototypes */
  numOfProtos = malloc(numOfWeights * sizeof(*numOfProtos));
  for(i=0; i<numOfWeights; ++i)
  {
    numOfProtos[i] = 0;
  }
  currWeight = RCFs->fams[0]->weight;
  currIdx = 0;
  for(i=0; i<RCFs->nofFams; ++i)
  {
    if(RCFs->fams[i]->weight != currWeight)
    {
      ++currIdx;
      currWeight = RCFs->fams[i]->weight;
    }
    ++numOfProtos[currIdx];
  }

   /*allocate everything*/
  URFrel = malloc(numOfWeights * sizeof(*URFrel));
  for(i=0; i<numOfWeights; ++i)
  {
    URFrel[i] = malloc(numOfProtos[i] * sizeof(*URFrel[i]));
    *URFrel[i] = malloc(numOfProtos[i] * numOfProtos[i] * sizeof(**URFrel[i]));
    for(j=1; j<numOfProtos[i]; ++j)
    {
      URFrel[i][j] = URFrel[i][j-1] + numOfProtos[i];
    }
  }

  /*initialize with zeros*/
  for(i=0; i<numOfWeights; ++i)
  {
    for(j=0; j<numOfProtos[i]; ++j)
    {
      for(k=0; k<numOfProtos[i]; ++k)
      {
        URFrel[i][j][k] = 0;
      }
    }
  }

  urfInfo->nofWeights = numOfWeights;
  urfInfo->nofProtos = numOfProtos;
  urfInfo->URFrel = URFrel;

  return urfInfo;
}